

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser.hpp
# Opt level: O2

vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
* __thiscall
bioparser::FastaParser<biosoup::Sequence>::Parse
          (vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
           *__return_storage_ptr__,FastaParser<biosoup::Sequence> *this,uint64_t bytes,
          bool shorten_names)

{
  char cVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t data_ptr;
  uint64_t parsed_bytes;
  anon_class_40_5_f07f430f create_T;
  bool local_6d;
  uint32_t local_6c;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  *local_68;
  uint64_t local_60;
  anon_class_40_5_f07f430f local_58;
  
  local_58.shorten_names = &local_6d;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.parsed_bytes = &local_60;
  local_60 = 0;
  local_58.data_ptr = &local_6c;
  local_6c = 0;
  bVar3 = 1;
  bVar4 = false;
  local_6d = shorten_names;
  local_68 = __return_storage_ptr__;
  local_58.this = this;
  local_58.dst = __return_storage_ptr__;
  while( true ) {
    uVar6 = (ulong)(this->super_Parser<biosoup::Sequence>).buffer_ptr_;
    while( true ) {
      uVar5 = (uint)uVar6;
      if ((this->super_Parser<biosoup::Sequence>).buffer_bytes_ <= uVar6) break;
      cVar1 = (this->super_Parser<biosoup::Sequence>).buffer_.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar6];
      if (cVar1 == '\n') {
        Parser<biosoup::Sequence>::Store
                  (&this->super_Parser<biosoup::Sequence>,
                   (ulong)(uVar5 - (this->super_Parser<biosoup::Sequence>).buffer_ptr_),(bool)~bVar3
                  );
        if (bVar3 != 0) {
          local_6c = (this->super_Parser<biosoup::Sequence>).storage_ptr_;
          bVar3 = 0;
        }
      }
      else if (!(bool)(cVar1 != '>' | bVar3)) {
        Parse::anon_class_40_5_f07f430f::operator()(&local_58);
        bVar3 = 1;
        if (bytes <= local_60) {
          return local_68;
        }
      }
      uVar6 = uVar6 + 1;
    }
    uVar2 = (this->super_Parser<biosoup::Sequence>).buffer_ptr_;
    if (uVar2 < uVar5) {
      Parser<biosoup::Sequence>::Store
                (&this->super_Parser<biosoup::Sequence>,(ulong)(uVar5 - uVar2),(bool)~bVar3);
    }
    if (bVar4 != false) break;
    bVar4 = Parser<biosoup::Sequence>::Read(&this->super_Parser<biosoup::Sequence>);
  }
  if ((this->super_Parser<biosoup::Sequence>).storage_ptr_ != 0) {
    Parse::anon_class_40_5_f07f430f::operator()(&local_58);
  }
  return local_68;
}

Assistant:

std::vector<std::unique_ptr<T>> Parse(
      std::uint64_t bytes, bool shorten_names = true) override {
    std::vector<std::unique_ptr<T>> dst;
    std::uint64_t parsed_bytes = 0;
    std::uint32_t data_ptr = 0;

    auto create_T = [&] () -> void {
      if (data_ptr == 0) {
        throw std::invalid_argument(
            "[bioparser::FastaParser] error: invalid file format");
      }

      auto name_len = shorten_names ?
          this->Shorten(this->storage().data(), data_ptr) :
          this->RightStrip(this->storage().data(), data_ptr);

      auto data_len = this->storage_ptr() - data_ptr;

      if (name_len == 0 || this->storage()[0] != '>' || data_len == 0) {
        throw std::invalid_argument(
            "[bioparser::FastaParser] error: invalid file format");
      }

      dst.emplace_back(std::unique_ptr<T>(new T(
          static_cast<const char*>(this->storage().data() + 1), name_len - 1,
          static_cast<const char*>(this->storage().data() + data_ptr), data_len)));  // NOLINT

      parsed_bytes += this->storage_ptr();
      data_ptr = 0;
      this->Clear();
    };

    bool is_eof = false;
    bool is_name = true;

    while (true) {
      auto buffer_ptr = this->buffer_ptr();
      for (; buffer_ptr < this->buffer_bytes(); ++buffer_ptr) {
        auto c = this->buffer()[buffer_ptr];
        if (c == '\n') {
          this->Store(buffer_ptr - this->buffer_ptr(), !is_name);
          if (is_name) {
            data_ptr = this->storage_ptr();
            is_name = false;
          }
        } else if (!is_name && c == '>') {
          is_name = true;
          create_T();
          if (parsed_bytes >= bytes) {
            return dst;
          }
        }
      }
      if (this->buffer_ptr() < buffer_ptr) {
        this->Store(buffer_ptr - this->buffer_ptr(), !is_name);
      }

      if (is_eof) {
        break;
      }
      is_eof = this->Read();
    }

    if (this->storage_ptr() != 0) {
      create_T();
    }

    return dst;
  }